

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

string * __thiscall
fmt::v7::detail::stringifier::operator()[abi_cxx11_
          (string *__return_storage_ptr__,stringifier *this,handle h)

{
  parse_context local_288;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> local_270;
  undefined **local_250;
  undefined1 *local_248;
  long lStack_240;
  size_t local_238;
  undefined1 local_230 [536];
  
  lStack_240 = 0;
  local_250 = &PTR_grow_00129cb0;
  local_238 = 500;
  local_288.format_str_.data_ = (char *)0x0;
  local_288.format_str_.size_ = 0;
  local_288.next_arg_id_ = 0;
  local_270.out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)&local_250;
  local_270.args_.desc_ = 0;
  local_270.loc_.locale_ = (void *)0x0;
  local_248 = local_230;
  (*h.custom_.format)(h.custom_.value,&local_288,&local_270);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_248,local_248 + lStack_240);
  local_250 = &PTR_grow_00129cb0;
  if (local_248 != local_230) {
    operator_delete(local_248,local_238);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(basic_format_arg<format_context>::handle h) const {
    memory_buffer buf;
    format_parse_context parse_ctx({});
    format_context format_ctx(buffer_appender<char>(buf), {}, {});
    h.format(parse_ctx, format_ctx);
    return to_string(buf);
  }